

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_Transform(sha2_word32 *state_in,sha2_word32 *data,sha2_word32 *state_out)

{
  sha2_word32 sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  sha2_word32 sVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  sha2_word32 sVar15;
  sha2_word32 sVar16;
  uint uVar17;
  long lVar18;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  sha2_word32 W256 [16];
  
  sVar1 = *state_in;
  W256._0_8_ = *(undefined8 *)(data + 0xc);
  W256._8_8_ = *(undefined8 *)(data + 0xe);
  local_58 = *(undefined8 *)(data + 8);
  uStack_50 = *(undefined8 *)(data + 10);
  local_68 = *(undefined8 *)(data + 4);
  uStack_60 = *(undefined8 *)(data + 6);
  local_78 = *(undefined8 *)data;
  uStack_70 = *(undefined8 *)(data + 2);
  lVar18 = 0;
  sVar16 = sVar1;
  sVar15 = state_in[1];
  uVar13 = state_in[2];
  uVar7 = state_in[3];
  sVar10 = state_in[4];
  uVar9 = state_in[5];
  uVar4 = state_in[6];
  uVar2 = state_in[7];
  do {
    uVar3 = uVar4;
    uVar4 = uVar9;
    uVar9 = sVar10;
    uVar8 = uVar13;
    uVar13 = sVar15;
    sVar15 = sVar16;
    iVar11 = ((uVar4 ^ uVar3) & uVar9 ^ uVar3) + uVar2 +
             ((uVar9 << 7 | uVar9 >> 0x19) ^
             (uVar9 << 0x15 | uVar9 >> 0xb) ^ (uVar9 << 0x1a | uVar9 >> 6)) +
             *(int *)((long)K256 + lVar18) + *(int *)((long)data + lVar18);
    sVar10 = uVar7 + iVar11;
    sVar16 = (uVar8 & uVar13 ^ (uVar8 ^ uVar13) & sVar15) +
             ((sVar15 << 10 | sVar15 >> 0x16) ^
             (sVar15 << 0x13 | sVar15 >> 0xd) ^ (sVar15 << 0x1e | sVar15 >> 2)) + iVar11;
    lVar18 = lVar18 + 4;
    uVar7 = uVar8;
    uVar2 = uVar3;
  } while (lVar18 != 0x40);
  lVar18 = 0x1e;
  do {
    uVar17 = sVar15;
    uVar5 = uVar4;
    uVar4 = uVar9;
    uVar9 = sVar10;
    uVar6 = uVar13;
    sVar15 = sVar16;
    uVar2 = (uint)lVar18;
    uVar13 = *(uint *)((long)&local_78 + (ulong)(uVar2 - 0xd & 0xf) * 4);
    uVar7 = *(uint *)((long)&local_78 + (ulong)(uVar2 & 0xf) * 4);
    iVar11 = *(int *)((long)sha512_initial_hash_value + lVar18 * 4 + 0x28);
    uVar12 = (ulong)(uVar2 - 0xe & 0xf);
    iVar14 = (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7)) +
             *(int *)((long)&local_78 + (ulong)(uVar2 - 5 & 0xf) * 4) +
             (uVar7 >> 10 ^ (uVar7 << 0xd | uVar7 >> 0x13) ^ (uVar7 << 0xf | uVar7 >> 0x11)) +
             *(int *)((long)&local_78 + uVar12 * 4);
    *(int *)((long)&local_78 + uVar12 * 4) = iVar14;
    iVar14 = iVar14 + ((uVar4 ^ uVar5) & uVar9 ^ uVar5) + uVar3 +
                      ((uVar9 << 7 | uVar9 >> 0x19) ^
                      (uVar9 << 0x15 | uVar9 >> 0xb) ^ (uVar9 << 0x1a | uVar9 >> 6)) + iVar11;
    sVar10 = uVar8 + iVar14;
    sVar16 = (uVar6 & uVar17 ^ (uVar6 ^ uVar17) & sVar15) +
             ((sVar15 << 10 | sVar15 >> 0x16) ^
             (sVar15 << 0x13 | sVar15 >> 0xd) ^ (sVar15 << 0x1e | sVar15 >> 2)) + iVar14;
    lVar18 = lVar18 + 1;
    uVar13 = uVar17;
    uVar8 = uVar6;
    uVar3 = uVar5;
  } while (lVar18 != 0x4e);
  *state_out = sVar16 + sVar1;
  state_out[1] = sVar15 + state_in[1];
  state_out[2] = uVar17 + state_in[2];
  state_out[3] = uVar6 + state_in[3];
  state_out[4] = sVar10 + state_in[4];
  state_out[5] = uVar9 + state_in[5];
  state_out[6] = uVar4 + state_in[6];
  state_out[7] = uVar5 + state_in[7];
  return;
}

Assistant:

void sha256_Transform(const sha2_word32* state_in, const sha2_word32* data, sha2_word32* state_out) {
	sha2_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word32	T1, T2, W256[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	f = state_in[5];
	g = state_in[6];
	h = state_in[7];

	j = 0;
	do {
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];	
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + 
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
	state_out[5] = state_in[5] + f;
	state_out[6] = state_in[6] + g;
	state_out[7] = state_in[7] + h;
}